

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser2_syntax.c
# Opt level: O0

RK_S32 vp9d_parser2_syntax(Vp9CodecContext *ctx)

{
  Vp9CodecContext *ctx_local;
  
  vp9d_fill_picparams(ctx,&ctx->pic_params);
  return 0;
}

Assistant:

RK_S32 vp9d_parser2_syntax(Vp9CodecContext *ctx)
{
    vp9d_fill_picparams(ctx, &ctx->pic_params);
    return 0;
}